

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

void __thiscall MyGame::Example::MonsterT::MonsterT(MonsterT *this,MonsterT *o)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  _Head_base<0UL,_MyGame::Example::Vec3_*,_false> _Var1;
  StatT *pSVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  double dVar6;
  uint64_t uVar7;
  LongEnum LVar8;
  float fVar9;
  float fVar10;
  int32_t iVar11;
  uint8_t uVar12;
  int8_t iVar13;
  Test TVar14;
  int16_t iVar15;
  uint32_t uVar16;
  float fVar17;
  _Head_base<0UL,_MyGame::Example::Vec3_*,_false> _Var18;
  MonsterT *this_01;
  StatT *this_02;
  InParentNamespaceT *pIVar19;
  MonsterT *pMVar20;
  unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
  *vector_of_referrables_;
  pointer puVar21;
  pointer puVar22;
  pointer puVar23;
  MonsterT *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  string *local_e0;
  MonsterT *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d0;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_c8;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_c0;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_b8;
  vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
  *local_b0;
  vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_> *local_a8;
  AnyAmbiguousAliasesUnion *local_a0;
  AnyUniqueAliasesUnion *local_98;
  vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *local_90;
  vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *local_88;
  vector<bool,_std::allocator<bool>_> *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  vector<long,_std::allocator<long>_> *local_70;
  vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *local_38;
  
  _Var1._M_head_impl =
       (o->pos)._M_t.
       super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
       _M_t.
       super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
       super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Vec3 *)0x0) {
    _Var18._M_head_impl = (Vec3 *)0x0;
  }
  else {
    _Var18._M_head_impl = (Vec3 *)operator_new(0x20);
    fVar9 = (_Var1._M_head_impl)->y_;
    fVar10 = (_Var1._M_head_impl)->z_;
    iVar11 = (_Var1._M_head_impl)->padding0__;
    dVar6 = (_Var1._M_head_impl)->test1_;
    uVar12 = (_Var1._M_head_impl)->test2_;
    iVar13 = (_Var1._M_head_impl)->padding1__;
    TVar14 = (_Var1._M_head_impl)->test3_;
    iVar15 = (_Var1._M_head_impl)->padding2__;
    (_Var18._M_head_impl)->x_ = (_Var1._M_head_impl)->x_;
    (_Var18._M_head_impl)->y_ = fVar9;
    (_Var18._M_head_impl)->z_ = fVar10;
    (_Var18._M_head_impl)->padding0__ = iVar11;
    (_Var18._M_head_impl)->test1_ = dVar6;
    (_Var18._M_head_impl)->test2_ = uVar12;
    (_Var18._M_head_impl)->padding1__ = iVar13;
    (_Var18._M_head_impl)->test3_ = TVar14;
    (_Var18._M_head_impl)->padding2__ = iVar15;
  }
  (this->pos)._M_t.
  super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
  super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = _Var18._M_head_impl;
  iVar15 = o->hp;
  this->mana = o->mana;
  this->hp = iVar15;
  std::__cxx11::string::string((string *)&this->name,(string *)&o->name);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->inventory,&o->inventory)
  ;
  this->color = o->color;
  AnyUnion::AnyUnion(&this->test,&o->test);
  local_38 = &this->test4;
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (local_38,&o->test4);
  local_40 = &this->testarrayofstring;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_40,&o->testarrayofstring);
  local_b0 = (vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
              *)&this->testarrayoftables;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar20 = (o->enemy)._M_t.
            super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
            ._M_t.
            super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
            .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl;
  if (pMVar20 == (MonsterT *)0x0) {
    this_01 = (MonsterT *)0x0;
  }
  else {
    this_01 = (MonsterT *)operator_new(800);
    MonsterT(this_01,pMVar20);
  }
  (this->enemy)._M_t.
  super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>.
  _M_t.
  super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
  .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl = this_01;
  local_48 = &this->testnestedflatbuffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_48,&o->testnestedflatbuffer);
  pSVar2 = (o->testempty)._M_t.
           super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
           ._M_t.
           super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
           .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
  if (pSVar2 == (StatT *)0x0) {
    this_02 = (StatT *)0x0;
  }
  else {
    this_02 = (StatT *)operator_new(0x30);
    StatT::StatT(this_02,pSVar2);
  }
  (this->testempty)._M_t.
  super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl = this_02;
  this->testbool = o->testbool;
  uVar16 = o->testhashu32_fnv1;
  this->testhashs32_fnv1 = o->testhashs32_fnv1;
  this->testhashu32_fnv1 = uVar16;
  uVar7 = o->testhashu64_fnv1;
  this->testhashs64_fnv1 = o->testhashs64_fnv1;
  this->testhashu64_fnv1 = uVar7;
  this->testhashs32_fnv1a = o->testhashs32_fnv1a;
  this->testhashu32_fnv1a = o->testhashu32_fnv1a;
  uVar7 = o->testhashu64_fnv1a;
  this->testhashs64_fnv1a = o->testhashs64_fnv1a;
  this->testhashu64_fnv1a = uVar7;
  this_00 = &this->testarrayofbools;
  std::vector<bool,_std::allocator<bool>_>::vector(this_00,&o->testarrayofbools);
  fVar9 = o->testf2;
  this->testf = o->testf;
  this->testf2 = fVar9;
  this->testf3 = o->testf3;
  local_50 = &this->testarrayofstring2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_50,&o->testarrayofstring2);
  local_58 = &this->testarrayofsortedstruct;
  std::vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>::vector
            (local_58,&o->testarrayofsortedstruct);
  local_60 = &this->flex;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_60,&o->flex);
  local_68 = &this->test5;
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (local_68,&o->test5);
  local_70 = &this->vector_of_longs;
  std::vector<long,_std::allocator<long>_>::vector(local_70,&o->vector_of_longs);
  local_78 = &this->vector_of_doubles;
  std::vector<double,_std::allocator<double>_>::vector(local_78,&o->vector_of_doubles);
  local_80 = this_00;
  if ((o->parent_namespace_test)._M_t.
      super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
      ._M_t.
      super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
      .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl ==
      (InParentNamespaceT *)0x0) {
    pIVar19 = (InParentNamespaceT *)0x0;
  }
  else {
    pIVar19 = (InParentNamespaceT *)operator_new(1);
  }
  (this->parent_namespace_test)._M_t.
  super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
  ._M_t.
  super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
  .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl = pIVar19;
  local_b8 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_referrables;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->single_weak_reference = o->single_weak_reference;
  local_88 = &this->vector_of_weak_references;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(local_88,&o->vector_of_weak_references);
  local_c0 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_strong_referrables;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->co_owning_reference = o->co_owning_reference;
  local_c8 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_co_owning_references;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->non_owning_reference = o->non_owning_reference;
  local_90 = &this->vector_of_non_owning_references;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(local_90,&o->vector_of_non_owning_references);
  local_98 = &this->any_unique;
  AnyUniqueAliasesUnion::AnyUniqueAliasesUnion(local_98,&o->any_unique);
  local_a0 = &this->any_ambiguous;
  AnyAmbiguousAliasesUnion::AnyAmbiguousAliasesUnion(local_a0,&o->any_ambiguous);
  std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::vector
            (&this->vector_of_enums,&o->vector_of_enums);
  this->signed_enum = o->signed_enum;
  local_d0 = &this->testrequirednestedflatbuffer;
  local_a8 = &this->vector_of_enums;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_d0,&o->testrequirednestedflatbuffer);
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->native_inline = o->native_inline;
  LVar8 = o->long_enum_normal_default;
  this->long_enum_non_enum_default = o->long_enum_non_enum_default;
  this->long_enum_normal_default = LVar8;
  fVar9 = o->inf_default;
  fVar10 = o->positive_inf_default;
  fVar17 = o->infinity_default;
  this->nan_default = o->nan_default;
  this->inf_default = fVar9;
  this->positive_inf_default = fVar10;
  this->infinity_default = fVar17;
  fVar9 = o->negative_inf_default;
  this->positive_infinity_default = o->positive_infinity_default;
  this->negative_inf_default = fVar9;
  this->negative_infinity_default = o->negative_infinity_default;
  this->double_inf_default = o->double_inf_default;
  local_e8 = &this->inventory;
  local_e0 = &this->name;
  local_d8 = this;
  std::
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
             *)local_b0,
            (long)(o->testarrayoftables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->testarrayoftables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar3 = (o->testarrayoftables).
           super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (o->testarrayoftables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar3; puVar21 = puVar21 + 1
      ) {
    if ((puVar21->_M_t).
        super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
        ._M_t.
        super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
        .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl == (MonsterT *)0x0)
    {
      pMVar20 = (MonsterT *)0x0;
    }
    else {
      pMVar20 = (MonsterT *)operator_new(800);
      MonsterT(pMVar20,(puVar21->_M_t).
                       super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
                       .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl);
    }
    local_f0 = pMVar20;
    std::
    vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
    ::emplace_back<MyGame::Example::MonsterT*>(local_b0,&local_f0);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_b8,
            (long)(o->vector_of_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar4 = (o->vector_of_referrables).
           super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (o->vector_of_referrables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar4; puVar22 = puVar22 + 1
      ) {
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        ._M_t.
        super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
        .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
        (ReferrableT *)0x0) {
      local_f0 = (MonsterT *)0x0;
    }
    else {
      local_f0 = (MonsterT *)operator_new(8);
      (local_f0->pos)._M_t.
      super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t
      .super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
      super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
           (Vec3 *)((puVar22->_M_t).
                    super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                    .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->id;
    }
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>(local_b8,(ReferrableT **)&local_f0);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_c0,
            (long)(o->vector_of_strong_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_strong_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar4 = (o->vector_of_strong_referrables).
           super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (o->vector_of_strong_referrables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar4; puVar22 = puVar22 + 1
      ) {
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        ._M_t.
        super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
        .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
        (ReferrableT *)0x0) {
      local_f0 = (MonsterT *)0x0;
    }
    else {
      local_f0 = (MonsterT *)operator_new(8);
      (local_f0->pos)._M_t.
      super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t
      .super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
      super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
           (Vec3 *)((puVar22->_M_t).
                    super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                    .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->id;
    }
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>(local_c0,(ReferrableT **)&local_f0);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_c8,
            (long)(o->vector_of_co_owning_references).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_co_owning_references).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar4 = (o->vector_of_co_owning_references).
           super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (o->vector_of_co_owning_references).
                 super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar4; puVar22 = puVar22 + 1
      ) {
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        ._M_t.
        super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
        .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
        (ReferrableT *)0x0) {
      local_f0 = (MonsterT *)0x0;
    }
    else {
      local_f0 = (MonsterT *)operator_new(8);
      (local_f0->pos)._M_t.
      super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t
      .super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
      super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
           (Vec3 *)((puVar22->_M_t).
                    super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                    .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->id;
    }
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>(local_c8,(ReferrableT **)&local_f0);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ::reserve(&this->scalar_key_sorted_tables,
            (long)(o->scalar_key_sorted_tables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->scalar_key_sorted_tables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar5 = (o->scalar_key_sorted_tables).
           super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar23 = (o->scalar_key_sorted_tables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar5; puVar23 = puVar23 + 1
      ) {
    if ((puVar23->_M_t).
        super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
        .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl == (StatT *)0x0) {
      pMVar20 = (MonsterT *)0x0;
    }
    else {
      pMVar20 = (MonsterT *)operator_new(0x30);
      StatT::StatT((StatT *)pMVar20,
                   (puVar23->_M_t).
                   super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
                   .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl);
    }
    local_f0 = pMVar20;
    std::
    vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
    ::emplace_back<MyGame::Example::StatT*>
              ((vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
                *)&this->scalar_key_sorted_tables,(StatT **)&local_f0);
  }
  return;
}

Assistant:

inline MonsterT::MonsterT(const MonsterT &o)
      : pos((o.pos) ? new MyGame::Example::Vec3(*o.pos) : nullptr),
        mana(o.mana),
        hp(o.hp),
        name(o.name),
        inventory(o.inventory),
        color(o.color),
        test(o.test),
        test4(o.test4),
        testarrayofstring(o.testarrayofstring),
        enemy((o.enemy) ? new MyGame::Example::MonsterT(*o.enemy) : nullptr),
        testnestedflatbuffer(o.testnestedflatbuffer),
        testempty((o.testempty) ? new MyGame::Example::StatT(*o.testempty) : nullptr),
        testbool(o.testbool),
        testhashs32_fnv1(o.testhashs32_fnv1),
        testhashu32_fnv1(o.testhashu32_fnv1),
        testhashs64_fnv1(o.testhashs64_fnv1),
        testhashu64_fnv1(o.testhashu64_fnv1),
        testhashs32_fnv1a(o.testhashs32_fnv1a),
        testhashu32_fnv1a(o.testhashu32_fnv1a),
        testhashs64_fnv1a(o.testhashs64_fnv1a),
        testhashu64_fnv1a(o.testhashu64_fnv1a),
        testarrayofbools(o.testarrayofbools),
        testf(o.testf),
        testf2(o.testf2),
        testf3(o.testf3),
        testarrayofstring2(o.testarrayofstring2),
        testarrayofsortedstruct(o.testarrayofsortedstruct),
        flex(o.flex),
        test5(o.test5),
        vector_of_longs(o.vector_of_longs),
        vector_of_doubles(o.vector_of_doubles),
        parent_namespace_test((o.parent_namespace_test) ? new MyGame::InParentNamespaceT(*o.parent_namespace_test) : nullptr),
        single_weak_reference(o.single_weak_reference),
        vector_of_weak_references(o.vector_of_weak_references),
        co_owning_reference(o.co_owning_reference),
        non_owning_reference(o.non_owning_reference),
        vector_of_non_owning_references(o.vector_of_non_owning_references),
        any_unique(o.any_unique),
        any_ambiguous(o.any_ambiguous),
        vector_of_enums(o.vector_of_enums),
        signed_enum(o.signed_enum),
        testrequirednestedflatbuffer(o.testrequirednestedflatbuffer),
        native_inline(o.native_inline),
        long_enum_non_enum_default(o.long_enum_non_enum_default),
        long_enum_normal_default(o.long_enum_normal_default),
        nan_default(o.nan_default),
        inf_default(o.inf_default),
        positive_inf_default(o.positive_inf_default),
        infinity_default(o.infinity_default),
        positive_infinity_default(o.positive_infinity_default),
        negative_inf_default(o.negative_inf_default),
        negative_infinity_default(o.negative_infinity_default),
        double_inf_default(o.double_inf_default) {
  testarrayoftables.reserve(o.testarrayoftables.size());
  for (const auto &testarrayoftables_ : o.testarrayoftables) { testarrayoftables.emplace_back((testarrayoftables_) ? new MyGame::Example::MonsterT(*testarrayoftables_) : nullptr); }
  vector_of_referrables.reserve(o.vector_of_referrables.size());
  for (const auto &vector_of_referrables_ : o.vector_of_referrables) { vector_of_referrables.emplace_back((vector_of_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_referrables_) : nullptr); }
  vector_of_strong_referrables.reserve(o.vector_of_strong_referrables.size());
  for (const auto &vector_of_strong_referrables_ : o.vector_of_strong_referrables) { vector_of_strong_referrables.emplace_back((vector_of_strong_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_strong_referrables_) : nullptr); }
  vector_of_co_owning_references.reserve(o.vector_of_co_owning_references.size());
  for (const auto &vector_of_co_owning_references_ : o.vector_of_co_owning_references) { vector_of_co_owning_references.emplace_back((vector_of_co_owning_references_) ? new ReferrableT(*vector_of_co_owning_references_) : nullptr); }
  scalar_key_sorted_tables.reserve(o.scalar_key_sorted_tables.size());
  for (const auto &scalar_key_sorted_tables_ : o.scalar_key_sorted_tables) { scalar_key_sorted_tables.emplace_back((scalar_key_sorted_tables_) ? new MyGame::Example::StatT(*scalar_key_sorted_tables_) : nullptr); }
}